

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall
inja::Parser::Parser
          (Parser *this,ParserConfig *parser_config,LexerConfig *lexer_config,
          TemplateStorage *template_storage,FunctionStorage *function_storage)

{
  FunctionStorage *function_storage_local;
  TemplateStorage *template_storage_local;
  LexerConfig *lexer_config_local;
  ParserConfig *parser_config_local;
  Parser *this_local;
  
  this->config = parser_config;
  Lexer::Lexer(&this->lexer,lexer_config);
  this->template_storage = template_storage;
  this->function_storage = function_storage;
  Token::Token(&this->tok);
  Token::Token(&this->peek_tok);
  this->have_peek_tok = false;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&this->literal_start);
  this->current_block = (BlockNode *)0x0;
  this->current_expression_list = (ExpressionListNode *)0x0;
  ::std::
  stack<inja::IfStatementNode*,std::deque<inja::IfStatementNode*,std::allocator<inja::IfStatementNode*>>>
  ::stack<std::deque<inja::IfStatementNode*,std::allocator<inja::IfStatementNode*>>,void>
            ((stack<inja::IfStatementNode*,std::deque<inja::IfStatementNode*,std::allocator<inja::IfStatementNode*>>>
              *)&this->if_statement_stack);
  ::std::
  stack<inja::ForStatementNode*,std::deque<inja::ForStatementNode*,std::allocator<inja::ForStatementNode*>>>
  ::stack<std::deque<inja::ForStatementNode*,std::allocator<inja::ForStatementNode*>>,void>
            ((stack<inja::ForStatementNode*,std::deque<inja::ForStatementNode*,std::allocator<inja::ForStatementNode*>>>
              *)&this->for_statement_stack);
  ::std::
  stack<inja::BlockStatementNode*,std::deque<inja::BlockStatementNode*,std::allocator<inja::BlockStatementNode*>>>
  ::stack<std::deque<inja::BlockStatementNode*,std::allocator<inja::BlockStatementNode*>>,void>
            ((stack<inja::BlockStatementNode*,std::deque<inja::BlockStatementNode*,std::allocator<inja::BlockStatementNode*>>>
              *)&this->block_statement_stack);
  return;
}

Assistant:

explicit Parser(const ParserConfig& parser_config, const LexerConfig& lexer_config, TemplateStorage& template_storage,
                  const FunctionStorage& function_storage)
      : config(parser_config), lexer(lexer_config), template_storage(template_storage), function_storage(function_storage) {}